

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t httplib::detail::write_content
                  (Stream *strm,ContentProviderWithCloser *content_provider,size_t offset,
                  size_t length)

{
  size_t __args;
  unsigned_long __args_1;
  anon_class_8_1_3562614c local_a8;
  function<void_()> local_a0;
  anon_class_24_3_758dca88 local_80;
  function<void_(const_char_*,_unsigned_long)> local_68;
  Stream *local_48;
  ssize_t written_length;
  size_t end_offset;
  size_t begin_offset;
  size_t length_local;
  size_t offset_local;
  ContentProviderWithCloser *content_provider_local;
  Stream *strm_local;
  
  written_length = offset + length;
  end_offset = offset;
  begin_offset = length;
  length_local = offset;
  offset_local = (size_t)content_provider;
  content_provider_local = (ContentProviderWithCloser *)strm;
  do {
    __args = length_local;
    if ((ulong)written_length <= length_local) {
      return length_local - end_offset;
    }
    local_48 = (Stream *)0x0;
    __args_1 = written_length - length_local;
    local_80.offset = &length_local;
    local_80.strm = (Stream *)content_provider_local;
    local_80.written_length = (ssize_t *)&local_48;
    std::function<void(char_const*,unsigned_long)>::
    function<httplib::detail::write_content(httplib::Stream&,std::function<void(unsigned_long,unsigned_long,std::function<void(char_const*,unsigned_long)>,std::function<void()>)>,unsigned_long,unsigned_long)::_lambda(char_const*,unsigned_long)_1_,void>
              ((function<void(char_const*,unsigned_long)> *)&local_68,&local_80);
    local_a8.written_length = (ssize_t *)&local_48;
    std::function<void()>::
    function<httplib::detail::write_content(httplib::Stream&,std::function<void(unsigned_long,unsigned_long,std::function<void(char_const*,unsigned_long)>,std::function<void()>)>,unsigned_long,unsigned_long)::_lambda()_1_,void>
              ((function<void()> *)&local_a0,&local_a8);
    std::
    function<void_(unsigned_long,_unsigned_long,_std::function<void_(const_char_*,_unsigned_long)>,_std::function<void_()>)>
    ::operator()(content_provider,__args,__args_1,&local_68,&local_a0);
    std::function<void_()>::~function(&local_a0);
    std::function<void_(const_char_*,_unsigned_long)>::~function(&local_68);
  } while (-1 < (long)local_48);
  return (ssize_t)local_48;
}

Assistant:

inline ssize_t write_content(Stream &strm,
                             ContentProviderWithCloser content_provider,
                             size_t offset, size_t length) {
  size_t begin_offset = offset;
  size_t end_offset = offset + length;
  while (offset < end_offset) {
    ssize_t written_length = 0;
    content_provider(
        offset, end_offset - offset,
        [&](const char *d, size_t l) {
          offset += l;
          written_length = strm.write(d, l);
        },
        [&](void) { written_length = -1; });
    if (written_length < 0) { return written_length; }
  }
  return static_cast<ssize_t>(offset - begin_offset);
}